

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_examples.cpp
# Opt level: O0

void density_tests::
     LfQueueSamples<(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
     ::samples(ostream *param_1)

{
  bool bVar1;
  bool bVar2;
  int *piVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  value_type *pvVar5;
  MessageInABottle *pMVar6;
  runtime_type<> *prVar7;
  ostream *poVar8;
  allocator_type *paVar9;
  pair<double,_int> pVar10;
  bool bool_2_1;
  reentrant_consume_operation consume_2_3;
  bool bool_1_1;
  reentrant_consume_operation consume_1_3;
  LfQueue queue_21;
  reentrant_consume_operation consume_2_2;
  reentrant_consume_operation consume_1_2;
  LfQueue queue_20;
  reentrant_consume_operation consume_5;
  bool pop_result_1;
  LfQueue queue_19;
  reentrant_consume_operation consume1;
  reentrant_consume_operation consume2;
  reentrant_put_transaction<void> put_3;
  double pi;
  reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  put_2;
  reentrant_put_transaction<int> put_1;
  LfQueue queue_18;
  bool bool_2;
  consume_operation consume_2_1;
  bool bool_1;
  consume_operation consume_1_1;
  LfQueue queue_17;
  consume_operation consume_2;
  consume_operation consume_1;
  LfQueue queue_16;
  consume_operation consume_4;
  bool pop_result;
  LfQueue queue_15;
  LfQueue queue_14;
  LfQueue queue_13;
  LfQueue queue_1_3;
  LfQueue queue_12;
  LfQueue queue_1_2;
  LfQueue queue_11;
  LfQueue *queue_ref;
  LfQueue queue_10;
  LfQueue queue_9;
  LfQueue queue_8;
  LfQueue_conflict queue_1_1;
  LfQueue_conflict queue_7;
  LfQueue queue_6;
  default_allocator allocator_1;
  LfQueue queue_5;
  default_allocator allocator;
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  queue_1;
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  queue_4;
  LfQueue queue_3;
  consume_operation consume_3;
  put_transaction<MessageInABottle> transaction;
  LfQueue queue_2;
  string my_string;
  int my_int;
  consume_operation consume;
  LfQueue queue;
  bool local_14d4;
  byte local_14d3;
  bool local_14d2;
  bool local_14d1;
  byte local_14aa;
  byte local_14a9;
  reentrant_consume_operation local_13f8;
  int local_13e0;
  undefined1 local_13d9;
  reentrant_consume_operation local_13d8;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  local_13c0;
  reentrant_consume_operation local_1338;
  int local_131c;
  reentrant_consume_operation local_1318;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  local_1300;
  reentrant_consume_operation local_1268;
  int local_124c [2];
  undefined1 local_1241;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  local_1240;
  reentrant_consume_operation local_1188;
  reentrant_consume_operation local_1170;
  runtime_type local_1158;
  reentrant_put_transaction<void> local_1150;
  reentrant_put_transaction<void> local_1130;
  undefined8 local_1110;
  reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1108;
  reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10e8;
  int local_10c4;
  reentrant_put_transaction<int> local_10c0;
  reentrant_put_transaction<int> local_10a0;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  local_1080;
  byte local_ff9;
  consume_operation local_ff8;
  int local_fe0;
  undefined1 local_fd9;
  consume_operation local_fd8;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  local_fc0;
  consume_operation local_f38;
  int local_f1c;
  consume_operation local_f18;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  local_f00;
  consume_operation local_e68;
  int local_e4c [2];
  undefined1 local_e41;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  local_e40;
  int local_d84;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  local_d80;
  int local_cc4;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  local_cc0;
  int local_c04;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  local_c00;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  local_b80;
  int local_ac4;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  local_ac0;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  local_a40;
  basic_default_allocator<65536UL> local_989;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  *local_988;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  local_980;
  basic_default_allocator<65536UL> local_8c1;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  local_8c0;
  basic_default_allocator<65536UL> local_803 [2];
  basic_default_allocator<65536UL> local_801;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  local_800;
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  local_780;
  double local_6d8;
  int local_6d0;
  int local_6c4;
  double local_6c0;
  pair<double,_int> local_6b8;
  allocator local_6a1;
  string local_6a0 [32];
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  local_680;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  local_600;
  basic_default_allocator<65536UL> local_541;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  local_540;
  basic_default_allocator<65536UL> local_481;
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  local_480;
  double local_3d0;
  int local_3c8;
  int local_3bc;
  double local_3b8;
  pair<double,_int> local_3b0;
  string local_3a0 [32];
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  local_380;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  local_300;
  consume_operation local_258;
  put_transaction<MessageInABottle> local_240;
  put_transaction<MessageInABottle> local_220;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  local_200;
  string local_178 [32];
  consume_operation local_158;
  int local_13c;
  consume_operation local_138;
  char local_119;
  int local_118 [5];
  int local_104;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  local_100;
  
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::lf_heter_queue(&local_100);
  local_104 = 0x13;
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::push<int>(&local_100,&local_104);
  local_118[0] = 8;
  local_119 = '*';
  density::
  lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::emplace<std::__cxx11::string,int,char>
            ((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
              *)&local_100,local_118,&local_119);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::try_start_consume(&local_138,&local_100);
  piVar3 = density::
           lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
           ::consume_operation::element<int>(&local_138);
  local_13c = *piVar3;
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::consume_operation::commit(&local_138);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::try_start_consume(&local_158,&local_100);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::consume_operation::operator=(&local_138,&local_158);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::consume_operation::~consume_operation(&local_158);
  pbVar4 = density::
           lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
           ::consume_operation::element<std::__cxx11::string>((consume_operation *)&local_138);
  std::__cxx11::string::string(local_178,(string *)pbVar4);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::consume_operation::commit(&local_138);
  std::__cxx11::string::~string(local_178);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::consume_operation::~consume_operation(&local_138);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue(&local_100);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::lf_heter_queue(&local_200);
  density::
  lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::
  start_emplace<density_tests::LfQueueSamples<(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>::samples(std::ostream&)::MessageInABottle>
            (&local_240,
             (lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
              *)&local_200);
  density::
  lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::
  put_transaction<density_tests::LfQueueSamples<(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>::samples(std::ostream&)::MessageInABottle>
  ::
  put_transaction<density_tests::LfQueueSamples<(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>::samples(std::ostream&)::MessageInABottle,void>
            ((put_transaction<density_tests::LfQueueSamples<(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>::samples(std::ostream&)::MessageInABottle>
              *)&local_220,&local_240);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::put_transaction<MessageInABottle>::~put_transaction(&local_240);
  pvVar5 = density::
           lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
           ::put_transaction<MessageInABottle>::raw_allocate_copy<char[13]>
                     (&local_220,(char (*) [13])"Hello world!");
  pMVar6 = density::
           lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
           ::put_transaction<MessageInABottle>::element<MessageInABottle,_nullptr>(&local_220);
  pMVar6->m_text = pvVar5;
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::put_transaction<MessageInABottle>::commit(&local_220);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::try_start_consume(&local_258,&local_200);
  prVar7 = density::
           lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
           ::consume_operation::complete_type(&local_258);
  bVar1 = density::runtime_type<>::is<std::__cxx11::string>(prVar7);
  if (bVar1) {
    pbVar4 = density::
             lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
             ::consume_operation::element<std::__cxx11::string>((consume_operation *)&local_258);
    poVar8 = std::operator<<((ostream *)&std::cout,(string *)pbVar4);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  }
  else {
    prVar7 = density::
             lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
             ::consume_operation::complete_type(&local_258);
    bVar1 = density::runtime_type<>::
            is<density_tests::LfQueueSamples<(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>::samples(std::ostream&)::MessageInABottle>
                      (prVar7);
    if (bVar1) {
      pMVar6 = density::
               lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
               ::consume_operation::
               element<density_tests::LfQueueSamples<(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>::samples(std::ostream&)::MessageInABottle>
                         ((consume_operation *)&local_258);
      poVar8 = std::operator<<((ostream *)&std::cout,pMVar6->m_text);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
  }
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::consume_operation::commit(&local_258);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::consume_operation::~consume_operation(&local_258);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::put_transaction<MessageInABottle>::~put_transaction(&local_220);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue(&local_200);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::lf_heter_queue(&local_300);
  bVar1 = density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::empty(&local_300);
  if (!bVar1) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0x97e,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue(&local_300);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::lf_heter_queue(&local_380);
  std::__cxx11::string::string(local_3a0);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>
  ::push<std::__cxx11::string>
            ((lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>
              *)&local_380,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a0);
  std::__cxx11::string::~string(local_3a0);
  local_3b8 = 4.0;
  local_3bc = 1;
  pVar10 = std::make_pair<double,int>(&local_3b8,&local_3bc);
  local_3d0 = pVar10.first;
  local_3c8 = pVar10.second;
  local_3b0.first = local_3d0;
  local_3b0.second = local_3c8;
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>
  ::push<std::pair<double,int>>
            ((lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>
              *)&local_380,&local_3b0);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::lf_heter_queue(&local_480,&local_380);
  bVar1 = density::
          lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
          ::empty(&local_380);
  if (!bVar1) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0x991,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  bVar1 = density::
          lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
          ::empty(&local_480);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!queue_1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0x992,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::~lf_heter_queue(&local_480);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::~lf_heter_queue(&local_380);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::lf_heter_queue(&local_540,&local_481);
  bVar1 = density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::empty(&local_540);
  if (!bVar1) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0x99f,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue(&local_540);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::lf_heter_queue(&local_600,&local_541);
  bVar1 = density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::empty(&local_600);
  if (!bVar1) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0x9ad,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue(&local_600);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::lf_heter_queue(&local_680);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6a0,"abc",&local_6a1);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::push<std::__cxx11::string>
            ((lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
              *)&local_680,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6a0);
  std::__cxx11::string::~string(local_6a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a1);
  local_6c0 = 4.0;
  local_6c4 = 1;
  pVar10 = std::make_pair<double,int>(&local_6c0,&local_6c4);
  local_6d8 = pVar10.first;
  local_6d0 = pVar10.second;
  local_6b8.first = local_6d8;
  local_6b8.second = local_6d0;
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::push<std::pair<double,int>>
            ((lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
              *)&local_680,&local_6b8);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::lf_heter_queue(&local_780);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::operator=(&local_780,&local_680);
  bVar1 = density::
          lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::empty(&local_680);
  if (!bVar1) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0x9c8,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  bVar1 = density::
          lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::empty(&local_780);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!queue_1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0x9ca,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue(&local_780);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue(&local_680);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::lf_heter_queue(&local_800);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::get_allocator(&local_800);
  bVar1 = density::basic_default_allocator<65536UL>::operator==(&local_801,local_803);
  if (!bVar1) {
    __assert_fail("queue.get_allocator() == default_allocator()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0x9d7,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue(&local_800);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::lf_heter_queue(&local_8c0);
  paVar9 = density::
           lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
           ::get_allocator_ref(&local_8c0);
  bVar1 = density::basic_default_allocator<65536UL>::operator==(paVar9,&local_8c1);
  if (!bVar1) {
    __assert_fail("queue.get_allocator_ref() == default_allocator()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0x9e4,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue(&local_8c0);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::lf_heter_queue(&local_980);
  local_988 = &local_980;
  paVar9 = density::
           lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
           ::get_allocator_ref(local_988);
  bVar1 = density::basic_default_allocator<65536UL>::operator==(paVar9,&local_989);
  if (!bVar1) {
    __assert_fail("queue_ref.get_allocator_ref() == default_allocator()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0x9f2,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue(&local_980);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::lf_heter_queue(&local_a40);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::lf_heter_queue(&local_ac0);
  local_ac4 = 1;
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::push<int>(&local_a40,&local_ac4);
  density::swap(&local_a40,&local_ac0);
  bVar1 = density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::empty(&local_a40);
  if (!bVar1) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0xa03,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  bVar1 = density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::empty(&local_ac0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!queue_1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0xa04,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue(&local_ac0);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue(&local_a40);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::lf_heter_queue(&local_b80);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::lf_heter_queue(&local_c00);
  local_c04 = 1;
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::push<int>(&local_b80,&local_c04);
  density::swap(&local_b80,&local_c00);
  bVar1 = density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::empty(&local_b80);
  if (!bVar1) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0xa16,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  bVar1 = density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::empty(&local_c00);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!queue_1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0xa17,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue(&local_c00);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue(&local_b80);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::lf_heter_queue(&local_cc0);
  bVar1 = density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::empty(&local_cc0);
  if (bVar1) {
    local_cc4 = 1;
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::push<int>(&local_cc0,&local_cc4);
    bVar1 = density::
            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::empty(&local_cc0);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!queue.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                    ,0xa26,
                    "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                   );
    }
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::~lf_heter_queue(&local_cc0);
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::lf_heter_queue(&local_d80);
    local_d84 = 1;
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::push<int>(&local_d80,&local_d84);
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::clear(&local_d80);
    bVar1 = density::
            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::empty(&local_d80);
    if (!bVar1) {
      __assert_fail("queue.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                    ,0xa35,
                    "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                   );
    }
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::~lf_heter_queue(&local_d80);
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::lf_heter_queue(&local_e40);
    local_e41 = density::
                lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                ::try_pop(&local_e40);
    if ((bool)local_e41) {
      __assert_fail("pop_result == false",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                    ,0xa44,
                    "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                   );
    }
    local_e4c[1] = 1;
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::push<int>(&local_e40,local_e4c + 1);
    local_e4c[0] = 2;
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::push<int>(&local_e40,local_e4c);
    local_e41 = density::
                lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                ::try_pop(&local_e40);
    if (!(bool)local_e41) {
      __assert_fail("pop_result == true",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                    ,0xa4a,
                    "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                   );
    }
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::try_start_consume(&local_e68,&local_e40);
    piVar3 = density::
             lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
             ::consume_operation::element<int>(&local_e68);
    if (*piVar3 != 2) {
      __assert_fail("consume.template element<int>() == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                    ,0xa4c,
                    "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                   );
    }
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::consume_operation::commit(&local_e68);
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::consume_operation::~consume_operation(&local_e68);
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::~lf_heter_queue(&local_e40);
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::lf_heter_queue(&local_f00);
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::try_start_consume(&local_f18,&local_f00);
    bVar1 = density::lf_heter_queue::consume_operation::operator_cast_to_bool
                      ((consume_operation *)&local_f18);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!consume_1",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                    ,0xa5c,
                    "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                   );
    }
    local_f1c = 0x2a;
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::push<int>(&local_f00,&local_f1c);
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::try_start_consume(&local_f38,&local_f00);
    bVar1 = density::lf_heter_queue::consume_operation::operator_cast_to_bool
                      ((consume_operation *)&local_f38);
    if (!bVar1) {
      __assert_fail("consume_2",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                    ,0xa61,
                    "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                   );
    }
    piVar3 = density::
             lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
             ::consume_operation::element<int>(&local_f38);
    if (*piVar3 == 0x2a) {
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::consume_operation::commit(&local_f38);
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::consume_operation::~consume_operation(&local_f38);
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::consume_operation::~consume_operation(&local_f18);
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::~lf_heter_queue(&local_f00);
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::lf_heter_queue(&local_fc0);
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::consume_operation::consume_operation(&local_fd8);
      local_fd9 = density::
                  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                  ::try_start_consume(&local_fc0,&local_fd8);
      local_14a9 = 0;
      if (!(bool)local_fd9) {
        bVar1 = density::lf_heter_queue::consume_operation::operator_cast_to_bool
                          ((consume_operation *)&local_fd8);
        local_14a9 = bVar1 ^ 0xff;
      }
      if ((local_14a9 & 1) == 0) {
        __assert_fail("!bool_1 && !consume_1",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                      ,0xa73,
                      "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                     );
      }
      local_fe0 = 0x2a;
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::push<int>(&local_fc0,&local_fe0);
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::consume_operation::consume_operation(&local_ff8);
      local_ff9 = density::
                  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                  ::try_start_consume(&local_fc0,&local_ff8);
      bVar1 = density::lf_heter_queue::consume_operation::operator_cast_to_bool
                        ((consume_operation *)&local_ff8);
      local_14aa = 0;
      if (bVar1) {
        local_14aa = local_ff9;
      }
      if ((local_14aa & 1) == 0) {
        __assert_fail("consume_2 && bool_2",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                      ,0xa79,
                      "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                     );
      }
      piVar3 = density::
               lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
               ::consume_operation::element<int>(&local_ff8);
      if (*piVar3 != 0x2a) {
        __assert_fail("consume_2.template element<int>() == 42",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                      ,0xa7a,
                      "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                     );
      }
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::consume_operation::commit(&local_ff8);
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::consume_operation::~consume_operation(&local_ff8);
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::consume_operation::~consume_operation(&local_fd8);
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::~lf_heter_queue(&local_fc0);
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::lf_heter_queue(&local_1080);
      local_10c4 = 1;
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::start_reentrant_push<int>(&local_10c0,&local_1080,&local_10c4);
      density::
      lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
      ::reentrant_put_transaction<int>::reentrant_put_transaction<int,void>
                ((reentrant_put_transaction<int> *)&local_10a0,&local_10c0);
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_10c0);
      density::
      lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
      ::start_reentrant_emplace<std::__cxx11::string,char_const(&)[13]>
                (&local_1108,
                 (lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                  *)&local_1080,(char (*) [13])"Hello world!");
      density::
      lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
      ::reentrant_put_transaction<std::__cxx11::string>::
      reentrant_put_transaction<std::__cxx11::string,void>
                ((reentrant_put_transaction<std::__cxx11::string> *)&local_10e8,&local_1108);
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::
      reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~reentrant_put_transaction(&local_1108);
      local_1110 = 0x40091eb851eb851f;
      local_1158.m_feature_table = (tuple_type *)density::runtime_type<>::make<double>();
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::start_reentrant_dyn_push_copy(&local_1150,&local_1080,&local_1158,&local_1110);
      density::
      lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
      ::reentrant_put_transaction<void>::reentrant_put_transaction<void,void>
                ((reentrant_put_transaction<void> *)&local_1130,&local_1150);
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::reentrant_put_transaction<void>::~reentrant_put_transaction(&local_1150);
      bVar1 = density::
              lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
              ::empty(&local_1080);
      if (!bVar1) {
        __assert_fail("queue.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                      ,0xa91,
                      "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                     );
      }
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::
      reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::commit(&local_10e8);
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::try_start_reentrant_consume(&local_1170,&local_1080);
      bVar1 = density::
              lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
              ::reentrant_consume_operation::empty(&local_1170);
      local_14d1 = false;
      if (!bVar1) {
        prVar7 = density::
                 lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                 ::reentrant_consume_operation::complete_type(&local_1170);
        local_14d1 = density::runtime_type<>::is<std::__cxx11::string>(prVar7);
      }
      if (local_14d1 == false) {
        __assert_fail("!consume2.empty() && consume2.complete_type().template is<std::string>()",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                      ,0xa96,
                      "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                     );
      }
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::reentrant_put_transaction<int>::commit(&local_10a0);
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::try_start_reentrant_consume(&local_1188,&local_1080);
      bVar1 = density::
              lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
              ::reentrant_consume_operation::empty(&local_1188);
      local_14d2 = false;
      if (!bVar1) {
        prVar7 = density::
                 lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                 ::reentrant_consume_operation::complete_type(&local_1188);
        local_14d2 = density::runtime_type<>::is<int>(prVar7);
      }
      if (local_14d2 == false) {
        __assert_fail("!consume1.empty() && consume1.complete_type().template is<int>()",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                      ,0xa9b,
                      "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                     );
      }
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::reentrant_put_transaction<void>::cancel(&local_1130);
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::reentrant_consume_operation::commit(&local_1188);
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::reentrant_consume_operation::commit(&local_1170);
      bVar1 = density::
              lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
              ::empty(&local_1080);
      if (!bVar1) {
        __assert_fail("queue.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                      ,0xaa1,
                      "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                     );
      }
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::reentrant_consume_operation::~reentrant_consume_operation(&local_1188);
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::reentrant_consume_operation::~reentrant_consume_operation(&local_1170);
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::reentrant_put_transaction<void>::~reentrant_put_transaction(&local_1130);
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::
      reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~reentrant_put_transaction(&local_10e8);
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_10a0);
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::~lf_heter_queue(&local_1080);
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      ::lf_heter_queue(&local_1240);
      local_1241 = density::
                   lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                   ::try_reentrant_pop(&local_1240);
      if (!(bool)local_1241) {
        local_124c[1] = 1;
        density::
        lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
        ::push<int>(&local_1240,local_124c + 1);
        local_124c[0] = 2;
        density::
        lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
        ::push<int>(&local_1240,local_124c);
        local_1241 = density::
                     lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     ::try_reentrant_pop(&local_1240);
        if (!(bool)local_1241) {
          __assert_fail("pop_result == true",
                        "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                        ,0xab6,
                        "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                       );
        }
        density::
        lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
        ::try_start_reentrant_consume(&local_1268,&local_1240);
        piVar3 = density::
                 lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                 ::reentrant_consume_operation::element<int>(&local_1268);
        if (*piVar3 != 2) {
          __assert_fail("consume.template element<int>() == 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                        ,0xab8,
                        "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                       );
        }
        density::
        lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
        ::reentrant_consume_operation::commit(&local_1268);
        density::
        lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
        ::reentrant_consume_operation::~reentrant_consume_operation(&local_1268);
        density::
        lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
        ::~lf_heter_queue(&local_1240);
        density::
        lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
        ::lf_heter_queue(&local_1300);
        density::
        lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
        ::try_start_reentrant_consume(&local_1318,&local_1300);
        bVar1 = density::lf_heter_queue::reentrant_consume_operation::operator_cast_to_bool
                          ((reentrant_consume_operation *)&local_1318);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          __assert_fail("!consume_1",
                        "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                        ,0xac8,
                        "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                       );
        }
        local_131c = 0x2a;
        density::
        lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
        ::push<int>(&local_1300,&local_131c);
        density::
        lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
        ::try_start_reentrant_consume(&local_1338,&local_1300);
        bVar1 = density::lf_heter_queue::reentrant_consume_operation::operator_cast_to_bool
                          ((reentrant_consume_operation *)&local_1338);
        if (bVar1) {
          piVar3 = density::
                   lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                   ::reentrant_consume_operation::element<int>(&local_1338);
          if (*piVar3 != 0x2a) {
            __assert_fail("consume_2.template element<int>() == 42",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                          ,0xace,
                          "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                         );
          }
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::reentrant_consume_operation::commit(&local_1338);
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::reentrant_consume_operation::~reentrant_consume_operation(&local_1338);
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::reentrant_consume_operation::~reentrant_consume_operation(&local_1318);
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::~lf_heter_queue(&local_1300);
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::lf_heter_queue(&local_13c0);
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::reentrant_consume_operation::reentrant_consume_operation(&local_13d8);
          local_13d9 = density::
                       lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                       ::try_start_reentrant_consume(&local_13c0,&local_13d8);
          local_14d3 = 0;
          if (!(bool)local_13d9) {
            bVar1 = density::lf_heter_queue::reentrant_consume_operation::operator_cast_to_bool
                              ((reentrant_consume_operation *)&local_13d8);
            local_14d3 = bVar1 ^ 0xff;
          }
          if ((local_14d3 & 1) != 0) {
            local_13e0 = 0x2a;
            density::
            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::push<int>(&local_13c0,&local_13e0);
            density::
            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::reentrant_consume_operation::reentrant_consume_operation(&local_13f8);
            bVar1 = density::
                    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                    ::try_start_reentrant_consume(&local_13c0,&local_13f8);
            bVar2 = density::lf_heter_queue::reentrant_consume_operation::operator_cast_to_bool
                              ((reentrant_consume_operation *)&local_13f8);
            local_14d4 = false;
            if (!bVar2) {
              bVar1 = local_14d4;
            }
            local_14d4 = bVar1;
            if (local_14d4 != false) {
              piVar3 = density::
                       lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                       ::reentrant_consume_operation::element<int>(&local_13f8);
              if (*piVar3 != 0x2a) {
                __assert_fail("consume_2.template element<int>() == 42",
                              "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                              ,0xae5,
                              "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                             );
              }
              density::
              lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
              ::reentrant_consume_operation::commit(&local_13f8);
              density::
              lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
              ::reentrant_consume_operation::~reentrant_consume_operation(&local_13f8);
              density::
              lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
              ::reentrant_consume_operation::~reentrant_consume_operation(&local_13d8);
              density::
              lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
              ::~lf_heter_queue(&local_13c0);
              nonblocking_heterogeneous_queue_put_samples();
              nonblocking_heterogeneous_queue_try_put_samples();
              nonblocking_heterogeneous_queue_put_transaction_samples();
              nonblocking_heterogeneous_queue_consume_operation_samples();
              nonblocking_heterogeneous_queue_reentrant_put_samples();
              nonblocking_heterogeneous_queue_reentrant_try_put_samples();
              nonblocking_heterogeneous_queue_reentrant_put_transaction_samples();
              nonblocking_heterogeneous_queue_reentrant_consume_operation_samples();
              return;
            }
            __assert_fail("consume_2 && bool_2",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                          ,0xae4,
                          "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                         );
          }
          __assert_fail("!bool_1 && !consume_1",
                        "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                        ,0xade,
                        "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                       );
        }
        __assert_fail("consume_2",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                      ,0xacd,
                      "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                     );
      }
      __assert_fail("pop_result == false",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                    ,0xab0,
                    "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                   );
    }
    __assert_fail("consume_2.template element<int>() == 42",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0xa62,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  __assert_fail("queue.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                ,0xa24,
                "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
               );
}

Assistant:

static void samples(std::ostream &)
{
    using namespace density;

    {
        //! [lf_heter_queue put example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;
        LfQueue queue;
        queue.push(19); // the parameter can be an l-value or an r-value
        queue.template emplace<std::string>(8, '*'); // pushes "********"
        //! [lf_heter_queue put example 1]

        //! [lf_heter_queue example 2]
        auto consume = queue.try_start_consume();
        int  my_int  = consume.template element<int>();
        consume.commit();

        consume               = queue.try_start_consume();
        std::string my_string = consume.template element<std::string>();
        consume.commit();
        //! [lf_heter_queue example 3
        (void)my_int;
        (void)my_string;
    }

    {
        //! [lf_heter_queue put example 2]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;
        LfQueue queue;
        struct MessageInABottle
        {
            const char * m_text = nullptr;
        };
        auto transaction             = queue.template start_emplace<MessageInABottle>();
        transaction.element().m_text = transaction.raw_allocate_copy("Hello world!");
        transaction.commit();
        //! [lf_heter_queue put example 2]

        //! [lf_heter_queue consume example 1]
        auto consume = queue.try_start_consume();
        if (consume.complete_type().template is<std::string>())
        {
            std::cout << consume.template element<std::string>() << std::endl;
        }
        else if (consume.complete_type().template is<MessageInABottle>())
        {
            std::cout << consume.template element<MessageInABottle>().m_text << std::endl;
        }
        consume.commit();
        //! [lf_heter_queue consume example 1]
    }

    {
        //! [lf_heter_queue default_construct example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;
        assert(queue.empty());
        //! [lf_heter_queue default_construct example 1]
    }
    {
        //! [lf_heter_queue move_construct example 1]
        using MyRunTimeType = runtime_type<
          f_default_construct,
          f_copy_construct,
          f_destroy,
          f_size,
          f_alignment,
          f_equal>;

        lf_heter_queue<MyRunTimeType> queue;
        queue.push(std::string());
        queue.push(std::make_pair(4., 1));

        lf_heter_queue<MyRunTimeType> queue_1(std::move(queue));

        assert(queue.empty());
        assert(!queue_1.empty());
        //! [lf_heter_queue move_construct example 1]
    }
    {
        //! [lf_heter_queue construct_copy_alloc example 1]
        default_allocator allocator;
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;
        LfQueue queue(allocator);
        assert(queue.empty());
        //! [lf_heter_queue construct_copy_alloc example 1]
    }
    {
        //! [lf_heter_queue construct_move_alloc example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        default_allocator allocator;
        LfQueue           queue(std::move(allocator));
        assert(queue.empty());
        //! [lf_heter_queue construct_move_alloc example 1]
    }
    {
        //! [lf_heter_queue move_assign example 1]
        using MyRunTimeType = runtime_type<
          f_default_construct,
          f_copy_construct,
          f_destroy,
          f_size,
          f_alignment,
          f_equal>;

        using LfQueue = lf_heter_queue<
          MyRunTimeType,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;
        queue.push(std::string("abc"));
        queue.push(std::make_pair(4., 1));

        LfQueue queue_1;
        queue_1 = std::move(queue);

        assert(queue.empty());

        assert(!queue_1.empty());
        //! [lf_heter_queue move_assign example 1]
    }
    {
        //! [lf_heter_queue get_allocator example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;
        assert(queue.get_allocator() == default_allocator());
        //! [lf_heter_queue get_allocator example 1]
    }
    {
        //! [lf_heter_queue get_allocator_ref example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;
        assert(queue.get_allocator_ref() == default_allocator());
        //! [lf_heter_queue get_allocator_ref example 1]
    }
    {
        //! [lf_heter_queue get_allocator_ref example 2]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue      queue;
        auto const & queue_ref = queue;
        assert(queue_ref.get_allocator_ref() == default_allocator());
        //! [lf_heter_queue get_allocator_ref example 2]
        (void)queue_ref;
    }
    {
        //! [lf_heter_queue swap example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue, queue_1;
        queue.push(1);
        swap(queue, queue_1);

        assert(queue.empty());
        assert(!queue_1.empty());
        //! [lf_heter_queue swap example 1]
    }
    {
        //! [lf_heter_queue swap example 2]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue, queue_1;
        queue.push(1);
        {
            using namespace std;
            swap(queue, queue_1);
        }
        assert(queue.empty());
        assert(!queue_1.empty());
        //! [lf_heter_queue swap example 2]
    }
    {
        //! [lf_heter_queue empty example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;
        assert(queue.empty());
        queue.push(1);
        assert(!queue.empty());
        //! [lf_heter_queue empty example 1]
    }
    {
        //! [lf_heter_queue clear example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;
        queue.push(1);
        queue.clear();
        assert(queue.empty());
        //! [lf_heter_queue clear example 1]
    }
    {
        //! [lf_heter_queue try_pop example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;

        bool pop_result = queue.try_pop();
        assert(pop_result == false);

        queue.push(1);
        queue.push(2);

        pop_result = queue.try_pop();
        assert(pop_result == true);
        auto consume = queue.try_start_consume();
        assert(consume.template element<int>() == 2);
        consume.commit();
        //! [lf_heter_queue try_pop example 1]
        (void)pop_result;
    }
    {
        //! [lf_heter_queue try_start_consume example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;
        auto    consume_1 = queue.try_start_consume();
        assert(!consume_1);

        queue.push(42);

        auto consume_2 = queue.try_start_consume();
        assert(consume_2);
        assert(consume_2.template element<int>() == 42);
        consume_2.commit();
        //! [lf_heter_queue try_start_consume example 1]
    }
    {
        //! [lf_heter_queue try_start_consume_ example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;

        typename LfQueue::consume_operation consume_1;
        bool const                          bool_1 = queue.try_start_consume(consume_1);
        assert(!bool_1 && !consume_1);

        queue.push(42);

        typename LfQueue::consume_operation consume_2;
        auto                                bool_2 = queue.try_start_consume(consume_2);
        assert(consume_2 && bool_2);
        assert(consume_2.template element<int>() == 42);
        consume_2.commit();
        //! [lf_heter_queue try_start_consume_ example 1]
        (void)bool_1;
        (void)bool_2;
    }
    {
        //! [lf_heter_queue reentrant example 1]
        // start 3 reentrant put transactions

        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;
        LfQueue queue;

        auto   put_1 = queue.start_reentrant_push(1);
        auto   put_2 = queue.template start_reentrant_emplace<std::string>("Hello world!");
        double pi    = 3.14;
        auto   put_3 = queue.start_reentrant_dyn_push_copy(runtime_type<>::make<double>(), &pi);
        assert(
          queue.empty()); // the queue is still empty, because no transaction has been committed

        // commit and start consuming "Hello world!"
        put_2.commit();
        auto consume2 = queue.try_start_reentrant_consume();
        assert(!consume2.empty() && consume2.complete_type().template is<std::string>());

        // commit and start consuming 1
        put_1.commit();
        auto consume1 = queue.try_start_reentrant_consume();
        assert(!consume1.empty() && consume1.complete_type().template is<int>());

        // cancel 3.14, and commit the consumes
        put_3.cancel();
        consume1.commit();
        consume2.commit();
        assert(queue.empty());

        //! [lf_heter_queue reentrant example 1]
    }
    {
        //! [lf_heter_queue try_reentrant_pop example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;
        LfQueue queue;

        bool pop_result = queue.try_reentrant_pop();
        assert(pop_result == false);

        queue.push(1);
        queue.push(2);

        pop_result = queue.try_reentrant_pop();
        assert(pop_result == true);
        auto consume = queue.try_start_reentrant_consume();
        assert(consume.template element<int>() == 2);
        consume.commit();
        //! [lf_heter_queue try_reentrant_pop example 1]
        (void)pop_result;
    }
    {
        //! [lf_heter_queue try_start_reentrant_consume example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;
        LfQueue queue;

        auto consume_1 = queue.try_start_reentrant_consume();
        assert(!consume_1);

        queue.push(42);

        auto consume_2 = queue.try_start_reentrant_consume();
        assert(consume_2);
        assert(consume_2.template element<int>() == 42);
        consume_2.commit();
        //! [lf_heter_queue try_start_reentrant_consume example 1]
    }
    {
        //! [lf_heter_queue try_start_reentrant_consume_ example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;
        LfQueue queue;

        typename LfQueue::reentrant_consume_operation consume_1;
        bool const bool_1 = queue.try_start_reentrant_consume(consume_1);
        assert(!bool_1 && !consume_1);

        queue.push(42);

        typename LfQueue::reentrant_consume_operation consume_2;
        auto bool_2 = queue.try_start_reentrant_consume(consume_2);
        assert(consume_2 && bool_2);
        assert(consume_2.template element<int>() == 42);
        consume_2.commit();
        //! [lf_heter_queue try_start_reentrant_consume_ example 1]
        (void)bool_2;
        (void)bool_1;
    }

    // this samples uses std::cout and std::cin
    // nonblocking_heterogeneous_queue_samples_1();

    nonblocking_heterogeneous_queue_put_samples();

    nonblocking_heterogeneous_queue_try_put_samples();

    nonblocking_heterogeneous_queue_put_transaction_samples();

    nonblocking_heterogeneous_queue_consume_operation_samples();

    nonblocking_heterogeneous_queue_reentrant_put_samples();

    nonblocking_heterogeneous_queue_reentrant_try_put_samples();

    nonblocking_heterogeneous_queue_reentrant_put_transaction_samples();

    nonblocking_heterogeneous_queue_reentrant_consume_operation_samples();
}